

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     iuUniversalPrinter<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
     ::Print(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *value,
            iu_ostream *os)

{
  iu_ostream *os_local;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *value_local;
  
  UniversalPrintTo<std::__cxx11::u16string>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }